

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walletdb.cpp
# Opt level: O1

LoadResult
wallet::LoadRecords(CWallet *pwallet,DatabaseBatch *batch,string *key,DataStream *prefix,
                   LoadFunc *load_func)

{
  pointer pcVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> parameters;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> parameters_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> parameters_01;
  bool bVar2;
  int iVar3;
  DBErrors DVar4;
  undefined8 uVar5;
  pointer pbVar6;
  DBErrors DVar7;
  ulong uVar8;
  long in_FS_OFFSET;
  unique_ptr<wallet::DatabaseCursor,_std::default_delete<wallet::DatabaseCursor>_> cursor;
  DataStream ssKey;
  string error;
  string type;
  undefined8 in_stack_fffffffffffffeb8;
  undefined8 in_stack_fffffffffffffec8;
  ulong uVar9;
  long *in_stack_fffffffffffffed0;
  DataStream local_128;
  DataStream local_108;
  CWallet *local_e0;
  long *local_d8 [2];
  long local_c8 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  long *local_78 [2];
  long local_68 [2];
  _Any_data *local_58 [2];
  _Any_data local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_108.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_108.m_read_pos = 0;
  local_108.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_108.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_128.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_128.m_read_pos = 0;
  local_128.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_128.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pbVar6 = (prefix->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
           _M_impl.super__Vector_impl_data._M_start + prefix->m_read_pos;
  (*batch->_vptr_DatabaseBatch[10])
            (&stack0xfffffffffffffed0,batch,pbVar6,
             (long)(prefix->vch).
                   super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)pbVar6);
  if (in_stack_fffffffffffffed0 == (long *)0x0) {
    pcVar1 = (key->_M_dataplus)._M_p;
    local_58[0] = &local_48;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_58,pcVar1,pcVar1 + key->_M_string_length);
    parameters_01._M_string_length = (size_type)pwallet;
    parameters_01._M_dataplus._M_p = (pointer)in_stack_fffffffffffffeb8;
    parameters_01.field_2._M_allocated_capacity = in_stack_fffffffffffffec8;
    parameters_01.field_2._8_8_ = in_stack_fffffffffffffed0;
    CWallet::WalletLogPrintf<std::__cxx11::string>
              (pwallet,"Error getting database cursor for \'%s\' records\n",parameters_01);
    uVar8 = 9;
    if (local_58[0] != &local_48) {
      operator_delete(local_58[0],local_48._M_unused._M_member_pointer + 1);
    }
    uVar9 = 0;
  }
  else {
    DVar7 = LOAD_OK;
    uVar9 = 0;
    do {
      iVar3 = (**(code **)(*in_stack_fffffffffffffed0 + 0x10))
                        (in_stack_fffffffffffffed0,&local_108,&local_128);
      if (iVar3 == 0) {
        local_78[0] = local_68;
        pcVar1 = (key->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_78,pcVar1,pcVar1 + key->_M_string_length);
        parameters_00._M_string_length = (size_type)pwallet;
        parameters_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffffeb8;
        parameters_00.field_2._M_allocated_capacity = uVar9;
        parameters_00.field_2._8_8_ = in_stack_fffffffffffffed0;
        CWallet::WalletLogPrintf<std::__cxx11::string>
                  (pwallet,"Error reading next \'%s\' record for wallet database\n",parameters_00);
        DVar7 = CORRUPT;
        if (local_78[0] != local_68) {
          operator_delete(local_78[0],local_68[0] + 1);
        }
LAB_001b34af:
        bVar2 = false;
      }
      else {
        if (iVar3 == 2) goto LAB_001b34af;
        local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
        local_98._M_string_length = 0;
        local_98.field_2._M_local_buf[0] = '\0';
        Unserialize<DataStream,char>(&local_108,&local_98);
        if (local_98._M_string_length != key->_M_string_length) {
LAB_001b357a:
          __assert_fail("type == key",
                        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/walletdb.cpp"
                        ,0x209,
                        "LoadResult wallet::LoadRecords(CWallet *, DatabaseBatch &, const std::string &, DataStream &, LoadFunc)"
                       );
        }
        if (local_98._M_string_length != 0) {
          iVar3 = bcmp(local_98._M_dataplus._M_p,(key->_M_dataplus)._M_p,local_98._M_string_length);
          if (iVar3 != 0) goto LAB_001b357a;
        }
        local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
        local_b8._M_string_length = 0;
        local_b8.field_2._M_local_buf[0] = '\0';
        local_e0 = pwallet;
        if ((load_func->super__Function_base)._M_manager == (_Manager_type)0x0) {
          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
            uVar5 = std::__throw_bad_function_call();
            if (local_58[0] != (_Any_data *)load_func) {
              operator_delete(local_58[0],(ulong)(local_48._M_unused._M_member_pointer + 1));
            }
            if (in_stack_fffffffffffffed0 != (long *)0x0) {
              (**(code **)(*in_stack_fffffffffffffed0 + 8))();
            }
            std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
                      ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&local_128)
            ;
            std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
                      ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&local_108)
            ;
            if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
              _Unwind_Resume(uVar5);
            }
          }
          goto LAB_001b36f1;
        }
        DVar4 = (*load_func->_M_invoker)
                          ((_Any_data *)load_func,&local_e0,&local_108,&local_128,&local_b8);
        if (DVar4 != LOAD_OK) {
          local_d8[0] = local_c8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_d8,local_b8._M_dataplus._M_p,
                     local_b8._M_dataplus._M_p + local_b8._M_string_length);
          parameters._M_string_length = (size_type)pwallet;
          parameters._M_dataplus._M_p = (pointer)in_stack_fffffffffffffeb8;
          parameters.field_2._M_allocated_capacity = uVar9;
          parameters.field_2._8_8_ = in_stack_fffffffffffffed0;
          CWallet::WalletLogPrintf<std::__cxx11::string>(pwallet,"%s\n",parameters);
          if (local_d8[0] != local_c8) {
            operator_delete(local_d8[0],local_c8[0] + 1);
          }
        }
        iVar3 = (int)uVar9;
        if ((int)DVar7 <= (int)DVar4) {
          DVar7 = DVar4;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
          operator_delete(local_b8._M_dataplus._M_p,
                          CONCAT71(local_b8.field_2._M_allocated_capacity._1_7_,
                                   local_b8.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p,
                          CONCAT71(local_98.field_2._M_allocated_capacity._1_7_,
                                   local_98.field_2._M_local_buf[0]) + 1);
        }
        uVar9 = (ulong)(iVar3 + 1);
        bVar2 = true;
      }
    } while (bVar2);
    uVar9 = uVar9 << 0x20;
    uVar8 = (ulong)DVar7;
  }
  if (in_stack_fffffffffffffed0 != (long *)0x0) {
    (**(code **)(*in_stack_fffffffffffffed0 + 8))();
  }
  std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
            ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&local_128);
  std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
            ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&local_108);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (LoadResult)(uVar9 | uVar8);
  }
LAB_001b36f1:
  __stack_chk_fail();
}

Assistant:

static LoadResult LoadRecords(CWallet* pwallet, DatabaseBatch& batch, const std::string& key, DataStream& prefix, LoadFunc load_func)
{
    LoadResult result;
    DataStream ssKey;
    DataStream ssValue{};

    Assume(!prefix.empty());
    std::unique_ptr<DatabaseCursor> cursor = batch.GetNewPrefixCursor(prefix);
    if (!cursor) {
        pwallet->WalletLogPrintf("Error getting database cursor for '%s' records\n", key);
        result.m_result = DBErrors::CORRUPT;
        return result;
    }

    while (true) {
        DatabaseCursor::Status status = cursor->Next(ssKey, ssValue);
        if (status == DatabaseCursor::Status::DONE) {
            break;
        } else if (status == DatabaseCursor::Status::FAIL) {
            pwallet->WalletLogPrintf("Error reading next '%s' record for wallet database\n", key);
            result.m_result = DBErrors::CORRUPT;
            return result;
        }
        std::string type;
        ssKey >> type;
        assert(type == key);
        std::string error;
        DBErrors record_res = load_func(pwallet, ssKey, ssValue, error);
        if (record_res != DBErrors::LOAD_OK) {
            pwallet->WalletLogPrintf("%s\n", error);
        }
        result.m_result = std::max(result.m_result, record_res);
        ++result.m_records;
    }
    return result;
}